

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operation.cpp
# Opt level: O0

void operation::subtractT(tensor *res,tensor a,tensor b,int *size)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int local_34;
  int local_30;
  int k;
  int j;
  int i;
  int *size_local;
  tensor b_local;
  tensor a_local;
  tensor *res_local;
  
  for (k = 0; k < size[2]; k = k + 1) {
    for (local_30 = 0; local_30 < size[1]; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < *size; local_34 = local_34 + 1) {
        lVar3 = (long)local_34;
        lVar2 = (long)local_30;
        lVar1 = (long)k;
        (*res)[lVar3][lVar2][lVar1] = a[lVar3][lVar2][lVar1] - b[lVar3][lVar2][lVar1];
      }
    }
  }
  return;
}

Assistant:

void subtractT(type::tensor* res, type::tensor a, type::tensor b, int size[])
    {
        for(int i(0); i < size[2]; i++)
            for(int j(0); j < size[1]; j++)
                for(int k(0); k < size[0]; k++)
                    (*res)[k][j][i] = a[k][j][i] - b[k][j][i];
    }